

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O1

int create_session_handle(AMQP_CONNECTION_INSTANCE_conflict *instance)

{
  int iVar1;
  SESSION_HANDLE session;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  session = session_create(instance->connection_handle,(ON_LINK_ATTACHED)0x0,(void *)0x0);
  instance->session_handle = session;
  if (session == (SESSION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xdc;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xdc;
    }
    pcVar4 = "Failed creating the AMQP connection (connection_create2 failed)";
    iVar3 = 0xdd;
  }
  else {
    iVar1 = session_set_incoming_window(session,0xffffffff);
    if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"create_session_handle",0xe3,1,
                "Failed to set the AMQP session incoming window size.");
    }
    iVar1 = session_set_outgoing_window(instance->session_handle,100);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    pcVar4 = "Failed to set the AMQP session outgoing window size.";
    iVar1 = 0;
    iVar3 = 0xe8;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
            ,"create_session_handle",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int create_session_handle(AMQP_CONNECTION_INSTANCE* instance)
{
    int result;

    if ((instance->session_handle = session_create(instance->connection_handle, NULL, NULL)) == NULL)
    {
        result = MU_FAILURE;
        LogError("Failed creating the AMQP connection (connection_create2 failed)");
    }
    else
    {
        if (session_set_incoming_window(instance->session_handle, (uint32_t)DEFAULT_INCOMING_WINDOW_SIZE) != 0)
        {
            LogError("Failed to set the AMQP session incoming window size.");
        }

        if (session_set_outgoing_window(instance->session_handle, DEFAULT_OUTGOING_WINDOW_SIZE) != 0)
        {
            LogError("Failed to set the AMQP session outgoing window size.");
        }

        result = RESULT_OK;
    }

    return result;
}